

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border.cpp
# Opt level: O0

void __thiscall ftxui::anon_unknown_0::Border::ComputeRequirement(Border *this)

{
  __shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var1;
  element_type *peVar2;
  size_type sVar3;
  int *piVar4;
  Requirement local_6c;
  int local_40;
  Requirement local_3c;
  Border *local_10;
  Border *this_local;
  
  local_10 = this;
  Node::ComputeRequirement(&this->super_Node);
  p_Var1 = (__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ::operator[](&(this->super_Node).children_,0);
  peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Var1);
  Node::requirement(&local_3c,peVar2);
  memcpy(&(this->super_Node).requirement_,&local_3c,0x2c);
  (this->super_Node).requirement_.min_x = (this->super_Node).requirement_.min_x + 2;
  (this->super_Node).requirement_.min_y = (this->super_Node).requirement_.min_y + 2;
  sVar3 = std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
          ::size(&(this->super_Node).children_);
  if (sVar3 == 2) {
    p_Var1 = (__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::
             vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
             operator[](&(this->super_Node).children_,1);
    peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var1);
    Node::requirement(&local_6c,peVar2);
    local_40 = local_6c.min_x + 2;
    piVar4 = std::max<int>(&(this->super_Node).requirement_.min_x,&local_40);
    (this->super_Node).requirement_.min_x = *piVar4;
  }
  (this->super_Node).requirement_.selected_box.x_min =
       (this->super_Node).requirement_.selected_box.x_min + 1;
  (this->super_Node).requirement_.selected_box.x_max =
       (this->super_Node).requirement_.selected_box.x_max + 1;
  (this->super_Node).requirement_.selected_box.y_min =
       (this->super_Node).requirement_.selected_box.y_min + 1;
  (this->super_Node).requirement_.selected_box.y_max =
       (this->super_Node).requirement_.selected_box.y_max + 1;
  return;
}

Assistant:

void ComputeRequirement() override {
    Node::ComputeRequirement();
    requirement_ = children_[0]->requirement();
    requirement_.min_x += 2;
    requirement_.min_y += 2;
    if (children_.size() == 2) {
      requirement_.min_x =
          std::max(requirement_.min_x, children_[1]->requirement().min_x + 2);
    }
    requirement_.selected_box.x_min++;
    requirement_.selected_box.x_max++;
    requirement_.selected_box.y_min++;
    requirement_.selected_box.y_max++;
  }